

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O1

EGLint deqp::egl::ChooseConfigRandomCase::getSurfaceType(Random *rnd)

{
  deBool dVar1;
  deBool dVar2;
  deBool dVar3;
  
  dVar1 = deRandom_getBool(&rnd->m_rnd);
  dVar2 = deRandom_getBool(&rnd->m_rnd);
  dVar3 = deRandom_getBool(&rnd->m_rnd);
  return (uint)(dVar3 == 1) | (uint)(dVar1 == 1) * 4 + (uint)(dVar2 == 1) * 2;
}

Assistant:

static EGLint getSurfaceType (de::Random& rnd)
	{
		EGLint bits = 0;
		bits |= rnd.getBool() ? EGL_WINDOW_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PIXMAP_BIT	: 0;
		bits |= rnd.getBool() ? EGL_PBUFFER_BIT	: 0;
		return bits;
	}